

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EntrySort(RecyclableObject *function,CallInfo callInfo,...)

{
  CallInfo scriptContext;
  bool bVar1;
  BOOL BVar2;
  Type TVar3;
  undefined4 *puVar4;
  Var pvVar5;
  ScriptContext *pSVar6;
  RecyclableObject *this;
  code *pcVar7;
  int in_stack_00000010;
  undefined1 local_88 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  CompareVarsInfo cvInfo;
  ArgumentReader args;
  
  pSVar6 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar6->threadContext,0xc00,pSVar6,(PVOID)0x0);
  if (in_stack_00000010 != (int)__tag.entry.next) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1b7d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar1) goto LAB_00b89dae;
    *puVar4 = 0;
  }
  cvInfo.compareType = (_func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *)__tag.entry.next;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)&cvInfo.compareType,(CallInfo *)&__tag.entry.next);
  scriptContext =
       (CallInfo)
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_88,function,(CallInfo)__tag.entry.next,
             L"Array.prototype.sort",&stack0x00000000);
  if (((ulong)__tag.entry.next & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1b81,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar1) goto LAB_00b89dae;
    *puVar4 = 0;
  }
  if (((ulong)cvInfo.compareType & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1b83,"(args.Info.Count >= 1)","Should have at least one argument"
                               );
    if (!bVar1) goto LAB_00b89dae;
    *puVar4 = 0;
  }
  if (((ulong)cvInfo.compareType & 0xfffffe) != 0) {
    pvVar5 = Arguments::operator[]((Arguments *)&cvInfo.compareType,1);
    bVar1 = JavascriptConversion::IsCallable(pvVar5);
    if (bVar1) {
      pvVar5 = Arguments::operator[]((Arguments *)&cvInfo.compareType,1);
      pSVar6 = (ScriptContext *)UnsafeVarTo<Js::RecyclableObject>(pvVar5);
      goto LAB_00b89cff;
    }
    pvVar5 = Arguments::operator[]((Arguments *)&cvInfo.compareType,1);
    if (pvVar5 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar1) goto LAB_00b89dae;
      *puVar4 = 0;
    }
    if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar1) goto LAB_00b89dae;
      *puVar4 = 0;
    }
    if ((ulong)pvVar5 >> 0x32 == 0 && ((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
      this = UnsafeVarTo<Js::RecyclableObject>(pvVar5);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar1) goto LAB_00b89dae;
        *puVar4 = 0;
      }
      TVar3 = ((this->type).ptr)->typeId;
      if (0x57 < (int)TVar3) {
        BVar2 = RecyclableObject::IsExternal(this);
        if (BVar2 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar1) {
LAB_00b89dae:
            pcVar7 = (code *)invalidInstructionException();
            (*pcVar7)();
          }
          *puVar4 = 0;
        }
        goto LAB_00b89cef;
      }
    }
    else {
LAB_00b89cef:
      TVar3 = TypeIds_FirstNumberType;
    }
    if (TVar3 != TypeIds_Undefined) {
      JavascriptError::ThrowTypeError
                ((ScriptContext *)scriptContext,-0x7ff5ec34,L"Array.prototype.sort");
    }
  }
  pSVar6 = (ScriptContext *)0x0;
LAB_00b89cff:
  cvInfo.scriptContext = (ScriptContext *)0x0;
  callInfo_local = scriptContext;
  if (pSVar6 == (ScriptContext *)0x0) {
    cvInfo.scriptContext = (ScriptContext *)0x0;
    cvInfo.compFn.ptr = (RecyclableObject *)stringCompare;
    pvVar5 = Arguments::operator[]((Arguments *)&cvInfo.compareType,0);
    pvVar5 = SortHelper<StringItem>(pvVar5,(CompareVarsInfo *)&callInfo_local);
  }
  else {
    Memory::Recycler::WBSetBit((char *)&cvInfo);
    cvInfo.scriptContext = pSVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&cvInfo);
    if (scriptContext ==
        (CallInfo)
        (((Type *)&(((pSVar6->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).globalObject)->ptr->super_JavascriptLibraryBase).
        scriptContext.ptr) {
      pcVar7 = compareVars;
    }
    else {
      pcVar7 = compareVarsCrossContext;
    }
    cvInfo.compFn.ptr = (RecyclableObject *)pcVar7;
    pvVar5 = Arguments::operator[]((Arguments *)&cvInfo.compareType,0);
    pvVar5 = SortHelper<Memory::WriteBarrierPtr<void>>(pvVar5,(CompareVarsInfo *)&callInfo_local);
  }
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_88);
  return pvVar5;
}

Assistant:

Var JavascriptArray::EntrySort(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Array.prototype.sort"));

        Assert(!(callInfo.Flags & CallFlags_New));

        AssertMsg(args.Info.Count >= 1, "Should have at least one argument");

        RecyclableObject* compFn = NULL;
        if (args.Info.Count > 1)
        {
            if (JavascriptConversion::IsCallable(args[1]))
            {
                compFn = UnsafeVarTo<RecyclableObject>(args[1]);
            }
            else
            {
                // Spec mandates that we throw if arg[1] is neither callable nor undefined
                if (JavascriptOperators::GetTypeId(args[1]) != TypeIds_Undefined)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.sort"));
                }
            }
        }

        // CompareVarsInfo struct holds data that will be used by sorting algorithm
        JavascriptArray::CompareVarsInfo cvInfo;
        cvInfo.scriptContext = scriptContext;
        if (compFn != NULL)
        {
            cvInfo.compFn = compFn;
            cvInfo.compareType = scriptContext == compFn->GetScriptContext() ? &compareVars : &compareVarsCrossContext;
            return JavascriptArray::SortHelper<Field(Var)>(args[0], &cvInfo);
        }
        else
        {
            cvInfo.compFn = nullptr;
            cvInfo.compareType = &stringCompare;
            return JavascriptArray::SortHelper<StringItem>(args[0], &cvInfo);
        }
    }